

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  ptls_buffer_t *buf;
  byte bVar1;
  st_ptls_early_data_receiver_t *psVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ushort uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint8_t *puVar22;
  ulong uVar23;
  uint8_t *input_00;
  ulong delta;
  uint8_t *puVar24;
  ptls_buffer_t *buf_00;
  ulong inlen_00;
  ulong __n;
  uint8_t uVar25;
  ptls_iovec_t message;
  size_t sStack_70;
  uint8_t *local_68;
  ptls_buffer_t *local_58;
  ulong local_50;
  ulong *local_48;
  ulong local_40;
  ptls_buffer_t *local_38;
  
  buf_00 = &(tls->recvbuf).rec;
  puVar22 = (tls->recvbuf).rec.base;
  puVar24 = (uint8_t *)*inlen;
  if (puVar24 < (uint8_t *)0x5 || puVar22 != (uint8_t *)0x0) {
    local_68 = (uint8_t *)0x0;
    if (puVar22 == (uint8_t *)0x0) goto LAB_0010bfb2;
LAB_0010c003:
    puVar24 = puVar24 + (long)input;
    uVar23 = (tls->recvbuf).rec.off;
    while (uVar23 < 5) {
      if ((uint8_t *)input == puVar24) {
        return 0x202;
      }
      uVar25 = *input;
      input = (void *)((long)input + 1);
      puVar22 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar23 + 1;
      puVar22[uVar23] = uVar25;
      uVar23 = (tls->recvbuf).rec.off;
    }
    puVar22 = (((anon_struct_64_2_7cec4369_for_recvbuf *)buf_00)->rec).base;
    uVar25 = *puVar22;
    uVar18 = *(ushort *)(puVar22 + 3);
    uVar18 = uVar18 << 8 | uVar18 >> 8;
    inlen_00 = (ulong)uVar18;
    if ((ushort)((uVar25 == '\x17' | 0x40) << 8) < uVar18) {
      return 0x32;
    }
    uVar21 = inlen_00 + 5;
    delta = uVar21 - uVar23;
    sStack_70 = inlen_00;
    local_58 = buf_00;
    if (delta != 0) {
      local_50 = uVar21;
      local_48 = inlen;
      local_40 = inlen_00;
      local_38 = decryptbuf;
      iVar19 = ptls_buffer_reserve(buf_00,delta);
      if (iVar19 != 0) {
        return iVar19;
      }
      __n = (long)puVar24 - (long)input;
      if (delta < (ulong)((long)puVar24 - (long)input)) {
        __n = delta;
      }
      uVar23 = (tls->recvbuf).rec.off;
      uVar21 = local_50;
      decryptbuf = local_38;
      inlen = local_48;
      inlen_00 = local_40;
      if (__n != 0) {
        memcpy((tls->recvbuf).rec.base + uVar23,input,__n);
        input = (void *)((long)input + __n);
        uVar23 = __n + (tls->recvbuf).rec.off;
        (tls->recvbuf).rec.off = uVar23;
        uVar21 = local_50;
        decryptbuf = local_38;
        inlen = local_48;
        inlen_00 = local_40;
      }
    }
    if (uVar23 != uVar21) {
      *inlen = (size_t)((long)input + (*inlen - (long)puVar24));
      return 0x202;
    }
    input_00 = ((ptls_buffer_t *)&local_58->base)->base + 5;
    puVar22 = (uint8_t *)((long)input + (*inlen - (long)puVar24));
    buf_00 = local_58;
  }
  else {
    uVar25 = *input;
    uVar18 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
    inlen_00 = (ulong)uVar18;
    if ((ushort)((uVar25 == '\x17' | 0x40) << 8) < uVar18) {
      return 0x32;
    }
    puVar22 = (uint8_t *)(inlen_00 + 5);
    if (puVar24 < puVar22) {
LAB_0010bfb2:
      local_68 = (uint8_t *)0x0;
      sStack_70 = 0;
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar19 = ptls_buffer_reserve(buf_00,5);
      if (iVar19 != 0) {
        return iVar19;
      }
      goto LAB_0010c003;
    }
    input_00 = (uint8_t *)((long)input + 5);
    sStack_70 = inlen_00;
  }
  *inlen = (size_t)puVar22;
  local_68 = input_00;
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    if (uVar25 != '\x17') {
      return 0x28;
    }
    iVar19 = ptls_buffer_reserve(decryptbuf,inlen_00 + 5);
    if (iVar19 != 0) {
      return iVar19;
    }
    iVar19 = ptls_aead_transform((tls->traffic_protection).dec.aead,
                                 decryptbuf->base + decryptbuf->off,&sStack_70,input_00,inlen_00,
                                 '\0');
    bVar1 = *(byte *)&(tls->field_7).server;
    if (iVar19 != 0) {
      uVar20 = 0x202;
      if ((bVar1 & 2) == 0) {
        return iVar19;
      }
      goto LAB_0010c453;
    }
    *(byte *)&(tls->field_7).server = bVar1 & 0xfd;
    local_68 = decryptbuf->base + decryptbuf->off;
    inlen_00 = sStack_70;
    do {
      if (inlen_00 == 0) {
        return 10;
      }
      inlen_00 = inlen_00 - 1;
    } while (local_68[inlen_00] == '\0');
    uVar25 = local_68[inlen_00];
    sStack_70 = inlen_00;
  }
  puVar22 = (tls->recvbuf).mess.base;
  if ((puVar22 == (uint8_t *)0x0) && (uVar25 != '\x16')) {
    if (uVar25 == '\x15') {
      uVar20 = 0x32;
      if (inlen_00 == 2) {
        bVar1 = local_68[1];
        if (*local_68 == '\x01') {
          uVar20 = 0;
          if (bVar1 == 0x5a) goto LAB_0010c453;
          if (bVar1 == 1) {
            psVar2 = (tls->field_7).server.early_data;
            if (psVar2 != (st_ptls_early_data_receiver_t *)0x0) {
              uVar3 = *(undefined4 *)psVar2->next_secret;
              uVar4 = *(undefined4 *)(psVar2->next_secret + 4);
              uVar5 = *(undefined4 *)(psVar2->next_secret + 8);
              uVar6 = *(undefined4 *)(psVar2->next_secret + 0xc);
              uVar7 = *(undefined4 *)(psVar2->next_secret + 0x10);
              uVar8 = *(undefined4 *)(psVar2->next_secret + 0x14);
              uVar9 = *(undefined4 *)(psVar2->next_secret + 0x18);
              uVar10 = *(undefined4 *)(psVar2->next_secret + 0x1c);
              uVar11 = *(undefined4 *)(psVar2->next_secret + 0x20);
              uVar12 = *(undefined4 *)(psVar2->next_secret + 0x24);
              uVar13 = *(undefined4 *)(psVar2->next_secret + 0x28);
              uVar14 = *(undefined4 *)(psVar2->next_secret + 0x2c);
              uVar15 = *(undefined4 *)(psVar2->next_secret + 0x34);
              uVar16 = *(undefined4 *)(psVar2->next_secret + 0x38);
              uVar17 = *(undefined4 *)(psVar2->next_secret + 0x3c);
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x30) =
                   *(undefined4 *)(psVar2->next_secret + 0x30);
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x34) = uVar15;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x38) = uVar16;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x3c) = uVar17;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x20) = uVar11;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x24) = uVar12;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x28) = uVar13;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x2c) = uVar14;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x10) = uVar7;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x14) = uVar8;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x18) = uVar9;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0x1c) = uVar10;
              *(undefined4 *)(tls->traffic_protection).dec.secret = uVar3;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 4) = uVar4;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 8) = uVar5;
              *(undefined4 *)((tls->traffic_protection).dec.secret + 0xc) = uVar6;
              (*ptls_clear_memory)(psVar2,0x40);
              free((tls->field_7).server.early_data);
              (tls->field_7).server.early_data = (st_ptls_early_data_receiver_t *)0x0;
              uVar20 = setup_traffic_protection(tls,tls->cipher_suite,0,(char *)0x0);
            }
            goto LAB_0010c453;
          }
        }
        uVar20 = bVar1 | 0x100;
      }
    }
    else {
      uVar20 = 10;
      if (uVar25 == '\x17') {
        if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
          if ((tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) &&
             (uVar20 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
            decryptbuf->off = decryptbuf->off + inlen_00;
          }
        }
        else {
          decryptbuf->off = decryptbuf->off + inlen_00;
          uVar20 = 0;
        }
      }
    }
    goto LAB_0010c453;
  }
  if (uVar25 != '\x16') {
    return 0x32;
  }
  buf = &(tls->recvbuf).mess;
  if (((puVar22 != (uint8_t *)0x0) || (inlen_00 < 4)) ||
     (puVar22 = local_68,
     inlen_00 - 4 !=
     ((ulong)local_68[3] | (ulong)((uint)local_68[2] << 8 | (uint)local_68[1] << 0x10)))) {
    iVar19 = ptls_buffer_reserve(buf,inlen_00);
    if (iVar19 != 0) {
      return iVar19;
    }
    memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,local_68,sStack_70);
    inlen_00 = (tls->recvbuf).mess.off + sStack_70;
    puVar22 = (tls->recvbuf).mess.base;
    (tls->recvbuf).mess.off = inlen_00;
    uVar20 = 0x202;
    if (inlen_00 < 4) goto LAB_0010c453;
    uVar23 = (ulong)puVar22[3] | (ulong)((uint)puVar22[2] << 8 | (uint)puVar22[1] << 0x10);
    if ((inlen_00 - 4 < uVar23) || (uVar20 = 0x32, uVar23 < inlen_00 - 4)) goto LAB_0010c453;
  }
  message.len = inlen_00;
  message.base = puVar22;
  uVar20 = handle_handshake_message(tls,sendbuf,message,properties);
  ptls_buffer__release_memory(buf);
  (tls->recvbuf).mess.off = 0;
  *(undefined8 *)&(tls->recvbuf).mess.is_allocated = 0;
  buf->base = (uint8_t *)0x0;
  (tls->recvbuf).mess.capacity = 0;
LAB_0010c453:
  ptls_buffer__release_memory(buf_00);
  buf_00->off = 0;
  *(undefined8 *)&buf_00->is_allocated = 0;
  buf_00->base = (uint8_t *)0x0;
  buf_00->capacity = 0;
  return uVar20;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (tls->traffic_protection.dec.aead != NULL) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = ptls_aead_transform(tls->traffic_protection.dec.aead, decryptbuf->base + decryptbuf->off, &rec.length,
                                       rec.fragment, rec.length, 0)) != 0) {
            if (tls->server.skip_early_data) {
                ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        tls->server.skip_early_data = 0;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {

        /* handshake */
        ptls_iovec_t message = {NULL};
        if (rec.type != PTLS_CONTENT_TYPE_HANDSHAKE)
            return PTLS_ALERT_DECODE_ERROR;

        /* handle the record directly, or buffer the message split into multiple records */
        if (tls->recvbuf.mess.base == NULL && test_handshake_message(rec.fragment, rec.length) == 0) {
            message = ptls_iovec_init(rec.fragment, rec.length);
        } else {
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec.length)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec.fragment, rec.length);
            tls->recvbuf.mess.off += rec.length;
            if ((ret = test_handshake_message(tls->recvbuf.mess.base, tls->recvbuf.mess.off)) == 0)
                message = ptls_iovec_init(tls->recvbuf.mess.base, tls->recvbuf.mess.off);
        }

        /* handle the complete message, if available */
        if (message.base != NULL) {
            ret = handle_handshake_message(tls, sendbuf, message, properties);
            ptls_buffer_dispose(&tls->recvbuf.mess);
        }

    } else {

        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}